

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int btreeOverwriteContent(MemPage *pPage,u8 *pDest,BtreePayload *pX,int iOffset,int iAmt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  
  iVar1 = pX->nData;
  uVar3 = iVar1 - iOffset;
  if (uVar3 == 0 || iVar1 < iOffset) {
    if (0 < iAmt) {
      uVar4 = 0;
      do {
        if (pDest[uVar4] != '\0') {
          iVar1 = sqlite3PagerWrite(pPage->pDbPage);
          if (iVar1 != 0) {
            return iVar1;
          }
          memset(pDest + uVar4,0,(long)iAmt - uVar4);
          return 0;
        }
        uVar4 = uVar4 + 1;
      } while ((uint)iAmt != uVar4);
    }
    iVar1 = 0;
  }
  else if ((iAmt - uVar3 == 0 || iAmt < (int)uVar3) ||
          (iVar1 = btreeOverwriteContent(pPage,pDest + uVar3,pX,iVar1,iAmt - uVar3), iAmt = uVar3,
          iVar1 == 0)) {
    iVar2 = bcmp(pDest,(void *)((long)pX->pData + (long)iOffset),(long)iAmt);
    iVar1 = 0;
    if ((iVar2 != 0) && (iVar1 = sqlite3PagerWrite(pPage->pDbPage), iVar1 == 0)) {
      memcpy(pDest,(void *)((long)iOffset + (long)pX->pData),(long)iAmt);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int btreeOverwriteContent(
  MemPage *pPage,           /* MemPage on which writing will occur */
  u8 *pDest,                /* Pointer to the place to start writing */
  const BtreePayload *pX,   /* Source of data to write */
  int iOffset,              /* Offset of first byte to write */
  int iAmt                  /* Number of bytes to be written */
){
  int nData = pX->nData - iOffset;
  if( nData<=0 ){
    /* Overwritting with zeros */
    int i;
    for(i=0; i<iAmt && pDest[i]==0; i++){}
    if( i<iAmt ){
      int rc = sqlite3PagerWrite(pPage->pDbPage);
      if( rc ) return rc;
      memset(pDest + i, 0, iAmt - i);
    }
  }else{
    if( nData<iAmt ){
      /* Mixed read data and zeros at the end.  Make a recursive call
      ** to write the zeros then fall through to write the real data */
      int rc = btreeOverwriteContent(pPage, pDest+nData, pX, iOffset+nData,
                                 iAmt-nData);
      if( rc ) return rc;
      iAmt = nData;
    }
    if( memcmp(pDest, ((u8*)pX->pData) + iOffset, iAmt)!=0 ){
      int rc = sqlite3PagerWrite(pPage->pDbPage);
      if( rc ) return rc;
      memcpy(pDest, ((u8*)pX->pData) + iOffset, iAmt);
    }
  }
  return SQLITE_OK;
}